

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  ulong in_RDX;
  uint *in_RSI;
  long in_RDI;
  GCstr *sx_3;
  GCstr *sx_2;
  MSize fh;
  int search_fullh;
  GCstr *sx_1;
  GCstr *sx;
  MSize h;
  uint collisions;
  uint8_t strflags;
  MSize len;
  GCobj *o;
  GCstr *s;
  global_State *g;
  uint32_t v_1;
  MSize i_1;
  uint32_t v;
  MSize i;
  MSize h_1;
  MSize d;
  MSize c;
  MSize b;
  MSize a;
  ErrMsg in_stack_fffffffffffffedc;
  GCSize in_stack_fffffffffffffee0;
  undefined3 uVar8;
  GCSize in_stack_fffffffffffffee4;
  void *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  GCstr *in_stack_ffffffffffffff00;
  MSize newmask;
  uint in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  uint local_e0;
  uint local_dc;
  byte local_d5;
  GCstr *local_d0;
  GCstr *local_a0;
  uint local_90;
  GCSize local_78;
  uint local_70;
  int local_54;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint *local_38;
  
  uVar2 = (uint)in_RDX;
  local_d5 = 0;
  local_dc = 0;
  if (0x7ffffeff < in_RDX) {
    lj_err_msg((lua_State *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
  }
  plVar7 = (long *)(ulong)*(uint *)(in_RDI + 8);
  if (uVar2 == 0) {
    local_a0 = (GCstr *)(plVar7 + 0x1f);
  }
  else {
    local_e0 = lua_hash((char *)in_RSI,uVar2);
    local_d0 = (GCstr *)(ulong)*(uint *)(*plVar7 + (ulong)(local_e0 & *(uint *)(plVar7 + 1)) * 4);
    if (((long)in_RSI + ((in_RDX & 0xffffffff) - 1) & 0xfff) < 0xffd) {
      for (; local_d0 != (GCstr *)0x0; local_d0 = (GCstr *)(ulong)(local_d0->nextgc).gcptr32) {
        if ((local_d0->hash == local_e0) && (local_d0->len == uVar2)) {
          local_dc = (uVar2 >> 4) + 1 + local_dc;
          local_70 = 0;
          do {
            uVar3 = *(uint *)((long)in_RSI + (ulong)local_70) ^
                    *(uint *)((long)&local_d0[1].nextgc.gcptr32 + (ulong)local_70);
            if (uVar3 != 0) {
              if ((int)(local_70 - uVar2) < -3) {
                in_stack_fffffffffffffef4 = 1;
                local_54 = in_stack_fffffffffffffef4;
              }
              else {
                in_stack_fffffffffffffef4 =
                     uVar3 << ((char)(local_70 - uVar2) * '\b' + 0x20U & 0x1f);
                local_54 = in_stack_fffffffffffffef4;
              }
              goto LAB_00124f58;
            }
            local_70 = local_70 + 4;
          } while (local_70 < uVar2);
          local_54 = 0;
LAB_00124f58:
          if (local_54 == 0) {
            if ((local_d0->marked & (*(byte *)(plVar7 + 0xb) ^ 3) & 3) != 0) {
              local_d0->marked = local_d0->marked ^ 3;
            }
            plVar7[6] = plVar7[6] + 1;
            return local_d0;
          }
        }
        local_dc = local_dc + 1;
      }
    }
    else {
      for (; local_d0 != (GCstr *)0x0; local_d0 = (GCstr *)(ulong)(local_d0->nextgc).gcptr32) {
        if ((local_d0->hash == local_e0) && (local_d0->len == uVar2)) {
          local_dc = (uVar2 >> 4) + 1 + local_dc;
          iVar6 = memcmp(in_RSI,local_d0 + 1,in_RDX & 0xffffffff);
          if (iVar6 == 0) {
            if ((local_d0->marked & (*(byte *)(plVar7 + 0xb) ^ 3) & 3) != 0) {
              local_d0->marked = local_d0->marked ^ 3;
            }
            plVar7[6] = plVar7[6] + 1;
            return local_d0;
          }
        }
        local_dc = local_dc + 1;
      }
    }
    newmask = (MSize)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    if (0xc < uVar2) {
      in_stack_fffffffffffffee8 = (void *)plVar7[2];
      bVar1 = (byte)(local_e0 >> 0x18);
      uVar3 = in_stack_fffffffffffffef0 & 0xffffff;
      if (((ulong)in_stack_fffffffffffffee8 & 1L << (bVar1 >> 2)) != 0) {
        uVar3 = CONCAT13((plVar7[3] & 1L << ((byte)(local_e0 >> 0x14) & 0x3f)) != 0,
                         (int3)in_stack_fffffffffffffef0);
      }
      in_stack_fffffffffffffef0 = uVar3;
      in_stack_ffffffffffffff0c = in_stack_fffffffffffffef0 >> 0x18;
      uVar8 = (undefined3)in_stack_fffffffffffffee4;
      in_stack_fffffffffffffee4 = CONCAT13(1,uVar8);
      if (in_stack_ffffffffffffff0c == 0) {
        in_stack_fffffffffffffee4 = CONCAT13(0x28 < local_dc,uVar8);
      }
      if ((char)(in_stack_fffffffffffffee4 >> 0x18) != '\0') {
        local_40 = 0;
        local_44 = 0;
        local_48 = 0xcafedead;
        local_4c = 0xdeadbeef;
        local_38 = in_RSI;
        for (local_3c = uVar2; 8 < local_3c; local_3c = local_3c - 8) {
          local_40 = *local_38 ^ local_40;
          local_44 = local_38[1] ^ local_44;
          local_48 = local_40 + local_48;
          local_4c = local_44 + local_4c;
          local_40 = (local_40 << 5 | local_40 >> 0x1b) - local_4c;
          local_44 = (local_44 << 7 | local_44 >> 0x19) - local_48;
          local_48 = (local_48 * 0x1000000 | local_48 >> 8) ^ local_40;
          local_4c = (local_4c * 2 | local_4c >> 0x1f) ^ local_44;
          local_38 = local_38 + 2;
        }
        local_40 = *(uint *)((long)local_38 + ((ulong)local_3c - 8)) ^ local_40;
        local_44 = *(uint *)((long)local_38 + ((ulong)local_3c - 4)) ^ local_44;
        uVar3 = (local_44 + local_48) - (local_40 << 9 | local_40 >> 0x17);
        uVar4 = (local_40 + local_4c) - (local_44 << 0x12 | local_44 >> 0xe);
        uVar5 = (uVar3 ^ uVar4) - (uVar3 * 0x2000000 | uVar3 >> 7);
        uVar4 = (uVar5 ^ (uVar4 * 0x2000 | uVar4 >> 0x13) +
                         uVar3 + (uVar2 - ((local_40 ^ local_44) << 7 |
                                          (local_40 ^ local_44) >> 0x19))) -
                (uVar5 * 0x10000 | uVar5 >> 0x10);
        uVar3 = (uVar4 ^ uVar3) - (uVar4 * 0x10 | uVar4 >> 0x1c);
        uVar3 = (uVar3 ^ uVar5) - (uVar3 * 0x4000 | uVar3 >> 0x12);
        in_stack_ffffffffffffff08 =
             (uVar3 ^ uVar4) - (uVar3 * 0x1000000 | uVar3 >> 8) >> 6 | local_e0 & 0xfc000000;
        if (in_stack_ffffffffffffff0c != 0) {
          local_d0 = (GCstr *)(ulong)*(uint *)(*plVar7 +
                                              (ulong)(in_stack_ffffffffffffff08 &
                                                     *(uint *)(plVar7 + 1)) * 4);
          if (((long)in_RSI + ((in_RDX & 0xffffffff) - 1) & 0xfff) < 0xffd) {
            for (; newmask = (MSize)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                local_d0 != (GCstr *)0x0; local_d0 = (GCstr *)(ulong)(local_d0->nextgc).gcptr32) {
              if ((local_d0->hash == in_stack_ffffffffffffff08) && (local_d0->len == uVar2)) {
                local_90 = 0;
                do {
                  uVar3 = *(uint *)((long)in_RSI + (ulong)local_90) ^
                          *(uint *)((long)&local_d0[1].nextgc.gcptr32 + (ulong)local_90);
                  if (uVar3 != 0) {
                    if ((int)(local_90 - uVar2) < -3) {
                      in_stack_fffffffffffffee0 = 1;
                      local_78 = in_stack_fffffffffffffee0;
                    }
                    else {
                      in_stack_fffffffffffffee0 =
                           uVar3 << ((char)(local_90 - uVar2) * '\b' + 0x20U & 0x1f);
                      local_78 = in_stack_fffffffffffffee0;
                    }
                    goto LAB_00125731;
                  }
                  local_90 = local_90 + 4;
                } while (local_90 < uVar2);
                local_78 = 0;
LAB_00125731:
                if (local_78 == 0) {
                  if ((local_d0->marked & (*(byte *)(plVar7 + 0xb) ^ 3) & 3) != 0) {
                    local_d0->marked = local_d0->marked ^ 3;
                  }
                  plVar7[6] = plVar7[6] + 1;
                  return local_d0;
                }
              }
              in_stack_ffffffffffffff00 = local_d0;
            }
          }
          else {
            for (; newmask = (MSize)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                local_d0 != (GCstr *)0x0; local_d0 = (GCstr *)(ulong)(local_d0->nextgc).gcptr32) {
              if (((local_d0->hash == in_stack_ffffffffffffff08) && (local_d0->len == uVar2)) &&
                 (iVar6 = memcmp(in_RSI,local_d0 + 1,in_RDX & 0xffffffff), iVar6 == 0)) {
                if ((local_d0->marked & (*(byte *)(plVar7 + 0xb) ^ 3) & 3) != 0) {
                  local_d0->marked = local_d0->marked ^ 3;
                }
                plVar7[6] = plVar7[6] + 1;
                return local_d0;
              }
            }
          }
        }
        if (0x28 < local_dc) {
          local_d5 = (byte)(local_e0 >> 0x14) & 0x3f | 0xc0;
          plVar7[2] = 1L << (bVar1 >> 2) | plVar7[2];
          plVar7[3] = 1L << ((byte)(local_e0 >> 0x14) & 0x3f) | plVar7[3];
          plVar7[4] = 1L << (bVar1 >> 2) | plVar7[4];
          plVar7[5] = 1L << ((byte)(local_e0 >> 0x14) & 0x3f) | plVar7[5];
          local_e0 = in_stack_ffffffffffffff08;
        }
      }
    }
    plVar7[7] = plVar7[7] + 1;
    local_a0 = (GCstr *)lj_mem_realloc((lua_State *)
                                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                       ,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                                       in_stack_fffffffffffffee0);
    local_a0->marked = *(byte *)(plVar7 + 0xb) & 3;
    local_a0->gct = '\x04';
    local_a0->len = uVar2;
    local_a0->hash = local_e0;
    local_a0->reserved = '\0';
    local_a0->strflags = local_d5;
    memcpy(local_a0 + 1,in_RSI,in_RDX & 0xffffffff);
    *(undefined1 *)((long)&local_a0[1].nextgc.gcptr32 + (in_RDX & 0xffffffff)) = 0;
    uVar2 = *(uint *)(plVar7 + 1);
    (local_a0->nextgc).gcptr32 = *(uint32_t *)(*plVar7 + (ulong)(uVar2 & local_e0) * 4);
    *(int *)(*plVar7 + (ulong)(uVar2 & local_e0) * 4) = (int)local_a0;
    uVar2 = *(uint *)((long)plVar7 + 0xc);
    *(uint *)((long)plVar7 + 0xc) = uVar2 + 1;
    if (*(uint *)(plVar7 + 1) < uVar2) {
      lj_str_resize((lua_State *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    newmask);
    }
  }
  return local_a0;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g;
  GCstr *s;
  GCobj *o;
  MSize len = (MSize)lenx;
  uint8_t strflags = 0;
#if LUAJIT_SMART_STRINGS
  unsigned collisions = 0;
#endif
  if (lenx >= LJ_MAX_STR)
    lj_err_msg(L, LJ_ERR_STROV);
  g = G(L);
  if (len == 0)
    return &g->strempty;
  /* Compute string hash. Constants taken from lookup3 hash by Bob Jenkins. */
  MSize h = lua_hash(str, len);
  /* Check if the string has already been interned. */
  o = gcref(g->strhash[h & g->strmask]);
#if LUAJIT_SMART_STRINGS
/*
** The default "fast" string hash function samples only a few positions
** in a string, the remaining bytes don't affect the function's result.
** The function performs well for short strings; however long strings
** can yield extremely high collision rates.
**
** An adaptive schema was implemented. Two hash functions are used
** simultaneously. A bucket is picked based on the output of the fast
** hash function. If an item is to be inserted in a collision chain
** longer than a certain threshold, another bucket is picked based on
** the stronger hash function. Since two hash functions are used
** simultaneously, insert should consider two buckets. The second bucket
** is often NOT considered thanks to the bloom filter. The filter is
** rebuilt during GC cycle.
**
** Parameters below were tuned on a set of benchmarks. Max_collisions is
** also backed by theory: the expected maximum length of a collision
** chain in a hash table with the fill factor of 1.0 is
** O(log(N)/log(log(N))), assuming uniformly distributed random keys.
** The upper bound for N=65,000 is 10, hence 40 is a clear indication of
** an anomaly.
**/
#define max_collisions 40
#define inc_collision_soft() (collisions++)
/* If different strings yield the same hash sum, grow counter faster. */
#define inc_collision_hard() (collisions+=1+(len>>4), 1)
#else
#define inc_collision_hard() (1)
#define inc_collision_soft()
#endif
  if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      str_fastcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  } else {  /* Slow path: end of string is too close to a page boundary. */
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      memcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  }
#if LUAJIT_SMART_STRINGS
  /* "Fast" hash function consumes all bytes of a string <= 12 bytes. */
  if (len > 12) {
    /*
    ** The bloom filter is keyed with the high 12 bits of the fast
    ** hash sum. The filter is rebuilt during GC cycle. It's beneficial
    ** to have these bits readily available and avoid hash sum
    ** recalculation during GC. High 6 bits are included in the "full"
    ** hash sum, and bits 19-25 are stored in s->strflags.
    **/
    int search_fullh =
       bloomtest(g->strbloom.cur[0], h>>(sizeof(h)*8- 6)) != 0 &&
       bloomtest(g->strbloom.cur[1], h>>(sizeof(h)*8-12)) != 0;
    if (LJ_UNLIKELY(search_fullh || collisions > max_collisions)) {
      MSize fh = lj_fullhash((const uint8_t*)str, len);
#define high6mask ((~(MSize)0)<<(sizeof(MSize)*8-6))
      fh = (fh >> 6) | (h & high6mask);
      if (search_fullh) {
	/* Recheck if the string has already been interned with "harder" hash. */
	o = gcref(g->strhash[fh & g->strmask]);
	if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && str_fastcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	} else {  /* Slow path: end of string is too close to a page boundary. */
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && memcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	}
      }
      if (collisions > max_collisions) {
	strflags = 0xc0 | ((h>>(sizeof(h)*8-12))&0x3f);
	bloomset(g->strbloom.cur[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.cur[1], h>>(sizeof(h)*8-12));
	bloomset(g->strbloom.next[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.next[1], h>>(sizeof(h)*8-12));
	h = fh;
      }
    }
  }
#endif
  g->strhash_miss++;
  /* Nope, create a new string. */
  s = lj_mem_newt(L, sizeof(GCstr)+len+1, GCstr);
  newwhite(g, s);
  s->gct = ~LJ_TSTR;
  s->len = len;
  s->hash = h;
  s->reserved = 0;
  s->strflags = strflags;
  memcpy(strdatawr(s), str, len);
  strdatawr(s)[len] = '\0';  /* Zero-terminate string. */
  /* Add it to string hash table. */
  h &= g->strmask;
  s->nextgc = g->strhash[h];
  /* NOBARRIER: The string table is a GC root. */
  setgcref(g->strhash[h], obj2gco(s));
  if (g->strnum++ > g->strmask)  /* Allow a 100% load factor. */
    lj_str_resize(L, (g->strmask<<1)+1);  /* Grow string table. */
  return s;  /* Return newly interned string. */
}